

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3Reindex(Parse *pParse,Token *pName1,Token *pName2)

{
  sqlite3 *db;
  char *zDatabase;
  int iVar1;
  uint iDb;
  Token *in_RAX;
  char *zName;
  CollSeq *pCVar2;
  Table *pTab;
  Index *pIndex;
  Token *pObjName;
  
  db = pParse->db;
  pObjName = in_RAX;
  iVar1 = sqlite3ReadSchema(pParse);
  if (iVar1 == 0) {
    if (pName1 == (Token *)0x0) {
      reindexDatabases(pParse,(char *)0x0);
      return;
    }
    if ((pName2 == (Token *)0x0) || (pName2->z == (char *)0x0)) {
      zName = sqlite3NameFromToken(pParse->db,pName1);
      if (zName == (char *)0x0) {
        return;
      }
      pCVar2 = sqlite3FindCollSeq(db,db->enc,zName,0);
      if (pCVar2 != (CollSeq *)0x0) {
        reindexDatabases(pParse,zName);
        goto LAB_0014bf30;
      }
      sqlite3DbFree(db,zName);
    }
    iDb = sqlite3TwoPartName(pParse,pName1,pName2,&pObjName);
    if ((-1 < (int)iDb) && (zName = sqlite3NameFromToken(db,pObjName), zName != (char *)0x0)) {
      zDatabase = db->aDb[iDb].zDbSName;
      pTab = sqlite3FindTable(db,zName,zDatabase);
      if (pTab == (Table *)0x0) {
        pIndex = sqlite3FindIndex(db,zName,zDatabase);
        sqlite3DbFree(db,zName);
        if (pIndex == (Index *)0x0) {
          sqlite3ErrorMsg(pParse,"unable to identify the object to be reindexed");
          return;
        }
        sqlite3BeginWriteOperation(pParse,0,iDb);
        sqlite3RefillIndex(pParse,pIndex,-1);
        return;
      }
      reindexTable(pParse,pTab,(char *)0x0);
LAB_0014bf30:
      sqlite3DbFree(db,zName);
      return;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Reindex(Parse *pParse, Token *pName1, Token *pName2){
  CollSeq *pColl;             /* Collating sequence to be reindexed, or NULL */
  char *z;                    /* Name of a table or index */
  const char *zDb;            /* Name of the database */
  Table *pTab;                /* A table in the database */
  Index *pIndex;              /* An index associated with pTab */
  int iDb;                    /* The database index number */
  sqlite3 *db = pParse->db;   /* The database connection */
  Token *pObjName;            /* Name of the table or index to be reindexed */

  /* Read the database schema. If an error occurs, leave an error message
  ** and code in pParse and return NULL. */
  if( SQLITE_OK!=sqlite3ReadSchema(pParse) ){
    return;
  }

  if( pName1==0 ){
    reindexDatabases(pParse, 0);
    return;
  }else if( NEVER(pName2==0) || pName2->z==0 ){
    char *zColl;
    assert( pName1->z );
    zColl = sqlite3NameFromToken(pParse->db, pName1);
    if( !zColl ) return;
    pColl = sqlite3FindCollSeq(db, ENC(db), zColl, 0);
    if( pColl ){
      reindexDatabases(pParse, zColl);
      sqlite3DbFree(db, zColl);
      return;
    }
    sqlite3DbFree(db, zColl);
  }
  iDb = sqlite3TwoPartName(pParse, pName1, pName2, &pObjName);
  if( iDb<0 ) return;
  z = sqlite3NameFromToken(db, pObjName);
  if( z==0 ) return;
  zDb = db->aDb[iDb].zDbSName;
  pTab = sqlite3FindTable(db, z, zDb);
  if( pTab ){
    reindexTable(pParse, pTab, 0);
    sqlite3DbFree(db, z);
    return;
  }
  pIndex = sqlite3FindIndex(db, z, zDb);
  sqlite3DbFree(db, z);
  if( pIndex ){
    sqlite3BeginWriteOperation(pParse, 0, iDb);
    sqlite3RefillIndex(pParse, pIndex, -1);
    return;
  }
  sqlite3ErrorMsg(pParse, "unable to identify the object to be reindexed");
}